

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lauxlib.c
# Opt level: O3

char * luaL_gsub(lua_State *L,char *s,char *p,char *r)

{
  size_t sVar1;
  char *pcVar2;
  char *__dest;
  size_t sz;
  luaL_Buffer b;
  luaL_Buffer local_2050;
  
  sVar1 = strlen(p);
  local_2050.b = local_2050.initb;
  local_2050.n = 0;
  local_2050.size = 0x2000;
  local_2050.L = L;
  pcVar2 = strstr(s,p);
  if (pcVar2 != (char *)0x0) {
    do {
      sz = (long)pcVar2 - (long)s;
      if (sz != 0) {
        __dest = luaL_prepbuffsize(&local_2050,sz);
        memcpy(__dest,s,sz);
        local_2050.n = local_2050.n + sz;
      }
      luaL_addstring(&local_2050,r);
      s = pcVar2 + sVar1;
      pcVar2 = strstr(s,p);
    } while (pcVar2 != (char *)0x0);
  }
  luaL_addstring(&local_2050,s);
  luaL_pushresult(&local_2050);
  pcVar2 = lua_tolstring(L,-1,(size_t *)0x0);
  return pcVar2;
}

Assistant:

LUALIB_API const char *luaL_gsub (lua_State *L, const char *s,
                                  const char *p, const char *r) {
  luaL_Buffer b;
  luaL_buffinit(L, &b);
  luaL_addgsub(&b, s, p, r);
  luaL_pushresult(&b);
  return lua_tostring(L, -1);
}